

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StepExporter.cpp
# Opt level: O3

void __thiscall
Assimp::StepExporter::StepExporter
          (StepExporter *this,aiScene *pScene,IOSystem *pIOSystem,string *path,string *file,
          ExportProperties *pProperties)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  locale local_60 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  string *local_48;
  string *local_40;
  locale local_38 [8];
  
  std::__cxx11::stringstream::stringstream((stringstream *)this);
  this->mProperties = pProperties;
  this->mIOSystem = pIOSystem;
  local_50 = &(this->mFile).field_2;
  (this->mFile)._M_dataplus._M_p = (pointer)local_50;
  pcVar2 = (file->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mFile,pcVar2,pcVar2 + file->_M_string_length);
  local_58 = &(this->mPath).field_2;
  (this->mPath)._M_dataplus._M_p = (pointer)local_58;
  pcVar2 = (path->_M_dataplus)._M_p;
  local_40 = &this->mFile;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mPath,pcVar2,pcVar2 + path->_M_string_length);
  this->mScene = pScene;
  (this->endstr)._M_dataplus._M_p = (pointer)&(this->endstr).field_2;
  local_48 = &this->mPath;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->endstr,";\n","");
  p_Var1 = &(this->trafos)._M_t._M_impl.super__Rb_tree_header;
  (this->trafos)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->trafos)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->trafos)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->trafos)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->trafos)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->meshes)._M_t._M_impl.super__Rb_tree_header;
  (this->meshes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->meshes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->meshes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->meshes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->meshes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  anon_unknown.dwarf_47c7b8::CollectTrafos(pScene->mRootNode,&this->trafos);
  anon_unknown.dwarf_47c7b8::CollectMeshes(pScene->mRootNode,&this->meshes);
  std::locale::locale(local_60,"C");
  std::ios::imbue(local_38);
  std::locale::~locale(local_38);
  std::locale::~locale(local_60);
  *(undefined8 *)(&this->field_0x8 + *(long *)(*(long *)this + -0x18)) = 8;
  WriteFile(this);
  return;
}

Assistant:

StepExporter::StepExporter(const aiScene* pScene, IOSystem* pIOSystem, const std::string& path,
    const std::string& file, const ExportProperties* pProperties) :
    mProperties(pProperties), mIOSystem(pIOSystem), mFile(file), mPath(path),
    mScene(pScene), endstr(";\n") {
    CollectTrafos(pScene->mRootNode, trafos);
    CollectMeshes(pScene->mRootNode, meshes);

    // make sure that all formatting happens using the standard, C locale and not the user's current locale
    mOutput.imbue(std::locale("C"));
    mOutput.precision(ASSIMP_AI_REAL_TEXT_PRECISION);

    // start writing
    WriteFile();
}